

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::CumulativeReporterBase::SectionNode::~SectionNode(SectionNode *this)

{
  SectionNode *this_local;
  
  ~SectionNode(this);
  operator_delete(this);
  return;
}

Assistant:

CumulativeReporterBase::SectionNode::~SectionNode() {}